

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int mbedtls_ecdh_read_params(mbedtls_ecdh_context *ctx,uchar **buf,uchar *end)

{
  int ret;
  uchar *end_local;
  uchar **buf_local;
  mbedtls_ecdh_context *ctx_local;
  
  ctx_local._4_4_ = mbedtls_ecp_tls_read_group(&ctx->grp,buf,(long)end - (long)*buf);
  if ((ctx_local._4_4_ == 0) &&
     (ctx_local._4_4_ = mbedtls_ecp_tls_read_point(&ctx->grp,&ctx->Qp,buf,(long)end - (long)*buf),
     ctx_local._4_4_ == 0)) {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecdh_read_params( mbedtls_ecdh_context *ctx,
                      const unsigned char **buf, const unsigned char *end )
{
    int ret;

    if( ( ret = mbedtls_ecp_tls_read_group( &ctx->grp, buf, end - *buf ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_ecp_tls_read_point( &ctx->grp, &ctx->Qp, buf, end - *buf ) )
                != 0 )
        return( ret );

    return( 0 );
}